

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQuatSetRotation.cpp
# Opt level: O2

void anon_unknown.dwarf_abc63::testRotation(V3f *from,V3f *to)

{
  uint __line;
  bool bVar1;
  char *__assertion;
  V3f t0;
  V3f n0M;
  V3f fQ0;
  V3f n0;
  V3f f0;
  V3f fM0;
  V3f fromQ;
  V3f fromM;
  Quat<float> local_88;
  M44f M;
  
  local_88.r = 1.0;
  local_88.v.x = 0.0;
  local_88.v.y = 0.0;
  local_88.v.z = 0.0;
  Imath_2_5::Quat<float>::setRotation(&local_88,from,to);
  Imath_2_5::Quat<float>::toMatrix44(&local_88);
  Imath_2_5::operator*(from,&M);
  Imath_2_5::operator*((Imath_2_5 *)&fromQ,from,&local_88);
  Imath_2_5::Vec3<float>::normalized(&t0);
  Imath_2_5::Vec3<float>::normalized(&fM0);
  Imath_2_5::Vec3<float>::normalized(&fQ0);
  bVar1 = Imath_2_5::Vec3<float>::equalWithAbsError(&t0,&fM0,2.3841858e-06);
  if (bVar1) {
    bVar1 = Imath_2_5::Vec3<float>::equalWithAbsError(&t0,&fQ0,2.3841858e-06);
    if (bVar1) {
      Imath_2_5::Vec3<float>::normalized(&f0);
      if (ABS(f0.z * t0.z + f0.x * t0.x + f0.y * t0.y) < 0.9) {
        Imath_2_5::Vec3<float>::operator%(from,to);
        Imath_2_5::Vec3<float>::normalized(&n0);
        Imath_2_5::operator*(&n0,&M);
        bVar1 = Imath_2_5::Vec3<float>::equalWithAbsError(&n0,&n0M,2.3841858e-06);
        if (!bVar1) {
          __assertion = "n0.equalWithAbsError (n0M, e)";
          __line = 0x58;
          goto LAB_0013880b;
        }
      }
      return;
    }
    __assertion = "t0.equalWithAbsError (fQ0, e)";
    __line = 0x4b;
  }
  else {
    __assertion = "t0.equalWithAbsError (fM0, e)";
    __line = 0x4a;
  }
LAB_0013880b:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testQuatSetRotation.cpp"
                ,__line,"void (anonymous namespace)::testRotation(const V3f &, const V3f &)");
}

Assistant:

void
testRotation (const V3f &from, const V3f &to)
{
    //
    // Build a quaternion.
    //

    Quatf Q;
    Q.setRotation (from, to);
    M44f M = Q.toMatrix44();

    //
    // Verify that the quaternion rotates vector from into vector to.
    //

    float e = 20 * limits<float>::epsilon();

    V3f fromM = from * M;
    V3f fromQ = from * Q;
    V3f t0 = to.normalized();
    V3f fM0 = fromM.normalized();
    V3f fQ0 = fromQ.normalized();

    assert (t0.equalWithAbsError (fM0, e));
    assert (t0.equalWithAbsError (fQ0, e));

    //
    // Verify that the rotation axis is the cross product of from and to.
    //

    V3f f0 = from.normalized();

    if (abs (f0 ^ t0) < 0.9)
    {
	V3f n0 = (from % to).normalized();
	V3f n0M = n0 * M;

	assert (n0.equalWithAbsError (n0M, e));
    }
}